

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O1

float Gia_ObjComputeArrival(Gia_Man_t *p,int iObj,int fUseSorting)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  void *pvVar6;
  uint uVar7;
  float fVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  int pPinPerm [32];
  float pPinDelays [32];
  int local_128 [32];
  float local_a8 [34];
  
  if (iObj < 0) {
LAB_0022a7d4:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if (p->nObjs <= iObj) goto LAB_0022a7d4;
  uVar9 = (uint)*(undefined8 *)(p->pObjs + (uint)iObj);
  if ((~uVar9 & 0x9fffffff) != 0) {
    if ((~uVar9 & 0x1fffffff) == 0 || -1 < (int)uVar9) {
      iVar2 = p->vMapping->nSize;
      if (iVar2 <= iObj) goto LAB_0022a688;
      piVar5 = p->vMapping->pArray;
      uVar9 = piVar5[(uint)iObj];
      uVar10 = (ulong)uVar9;
      if (uVar10 == 0) {
        __assert_fail("Gia_ObjIsLut(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSpeedup.c"
                      ,0x79,"float Gia_ObjComputeArrival(Gia_Man_t *, int, int)");
      }
      pvVar6 = p->pLutLib;
      if (pvVar6 == (void *)0x0) {
        if ((int)uVar9 < iVar2 && -1 < (int)uVar9) {
          uVar14 = 0;
          uVar13 = (ulong)(uint)piVar5[uVar10];
          if (piVar5[uVar10] < 1) {
            uVar13 = uVar14;
          }
          fVar16 = -1e+09;
          do {
            if (uVar13 == uVar14) goto LAB_0022a775;
            iVar3 = piVar5[uVar10 + uVar14 + 1];
            if (iVar3 < 0) goto LAB_0022a7b5;
            uVar7 = iVar3 * 3;
            uVar4 = p->vTiming->nSize;
            if (uVar4 == uVar7 || SBORROW4(uVar4,uVar7) != (int)(uVar4 + iVar3 * -3) < 0)
            goto LAB_0022a7b5;
            fVar15 = p->vTiming->pArray[uVar7];
            fVar8 = fVar15 + 1.0;
            if (fVar15 + 1.0 <= fVar16) {
              fVar8 = fVar16;
            }
            fVar16 = fVar8;
            uVar14 = uVar14 + 1;
          } while ((int)uVar9 < iVar2 && -1 < (int)uVar9);
        }
        goto LAB_0022a688;
      }
      if (*(int *)((long)pvVar6 + 0xc) == 0) {
        if (iVar2 <= (int)uVar9 || (int)uVar9 < 0) goto LAB_0022a688;
        lVar11 = (long)piVar5[uVar10];
        if (lVar11 < 1) {
LAB_0022a76d:
          fVar16 = -1e+09;
        }
        else {
          lVar12 = 0;
          fVar15 = -1e+09;
          do {
            iVar2 = piVar5[uVar10 + lVar12 + 1];
            if (iVar2 < 0) goto LAB_0022a7b5;
            uVar4 = iVar2 * 3;
            uVar9 = p->vTiming->nSize;
            if (uVar9 == uVar4 || SBORROW4(uVar9,uVar4) != (int)(uVar9 + iVar2 * -3) < 0)
            goto LAB_0022a7b5;
            fVar16 = p->vTiming->pArray[uVar4] + *(float *)((long)pvVar6 + lVar11 * 0x84 + 0x94);
            if (fVar16 <= fVar15) {
              fVar16 = fVar15;
            }
            lVar12 = lVar12 + 1;
            fVar15 = fVar16;
          } while (lVar11 != lVar12);
        }
      }
      else {
        if (iVar2 <= (int)uVar9 || (int)uVar9 < 0) goto LAB_0022a688;
        iVar2 = piVar5[uVar10];
        lVar11 = (long)iVar2 * 0x84 + 0x94;
        if (fUseSorting != 0) {
          Gia_LutDelayTraceSortPins(p,iObj,local_128,local_a8);
          iVar2 = p->vMapping->nSize;
          if (iObj < iVar2) {
            piVar5 = p->vMapping->pArray;
            iVar3 = piVar5[(uint)iObj];
            if ((-1 < (long)iVar3) && (iVar3 < iVar2)) {
              puVar1 = (uint *)(piVar5 + iVar3);
              uVar9 = *puVar1;
              uVar13 = 0;
              uVar10 = (ulong)uVar9;
              if ((int)uVar9 < 1) {
                uVar10 = uVar13;
              }
              fVar16 = -1e+09;
              do {
                if (uVar10 == uVar13) goto LAB_0022a775;
                uVar9 = puVar1[(long)local_128[uVar13] + 1];
                if ((int)uVar9 < 0) goto LAB_0022a7b5;
                uVar7 = uVar9 * 3;
                uVar4 = p->vTiming->nSize;
                if (uVar4 == uVar7 || SBORROW4(uVar4,uVar7) != (int)(uVar4 + uVar9 * -3) < 0)
                goto LAB_0022a7b5;
                fVar15 = p->vTiming->pArray[uVar7] + *(float *)((long)pvVar6 + uVar13 * 4 + lVar11);
                uVar13 = uVar13 + 1;
                if (fVar15 <= fVar16) {
                  fVar15 = fVar16;
                }
                fVar16 = fVar15;
              } while (iObj < iVar2);
            }
          }
          goto LAB_0022a688;
        }
        if (iVar2 < 1) goto LAB_0022a76d;
        lVar12 = 0;
        fVar15 = -1e+09;
        do {
          iVar3 = piVar5[uVar10 + lVar12 + 1];
          if (iVar3 < 0) goto LAB_0022a7b5;
          uVar4 = iVar3 * 3;
          uVar9 = p->vTiming->nSize;
          if (uVar9 == uVar4 || SBORROW4(uVar9,uVar4) != (int)(uVar9 + iVar3 * -3) < 0)
          goto LAB_0022a7b5;
          fVar16 = p->vTiming->pArray[uVar4] + *(float *)((long)pvVar6 + lVar12 * 4 + lVar11);
          if (fVar16 <= fVar15) {
            fVar16 = fVar15;
          }
          lVar12 = lVar12 + 1;
          fVar15 = fVar16;
        } while (iVar2 != lVar12);
      }
LAB_0022a775:
      iVar2 = p->vMapping->nSize;
      if (iObj < iVar2) {
        piVar5 = p->vMapping->pArray;
        iVar3 = piVar5[(uint)iObj];
        if ((-1 < (long)iVar3) && (iVar3 < iVar2)) {
          if (piVar5[iVar3] == 0) {
            return 0.0;
          }
          return fVar16;
        }
      }
LAB_0022a688:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if (p->nObjs <= iObj) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    iObj = iObj - (uVar9 & 0x1fffffff);
    if (iObj < 0) goto LAB_0022a7b5;
  }
  uVar4 = iObj * 3;
  uVar9 = p->vTiming->nSize;
  if (uVar9 != uVar4 && SBORROW4(uVar9,uVar4) == (int)(uVar9 + iObj * -3) < 0) {
    return p->vTiming->pArray[uVar4];
  }
LAB_0022a7b5:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
}

Assistant:

float Gia_ObjComputeArrival( Gia_Man_t * p, int iObj, int fUseSorting )
{
    If_LibLut_t * pLutLib = (If_LibLut_t *)p->pLutLib;
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    int k, iFanin, pPinPerm[32];
    float pPinDelays[32];
    float tArrival, * pDelays;
    if ( Gia_ObjIsCi(pObj) )
        return Gia_ObjTimeArrival(p, iObj);
    if ( Gia_ObjIsCo(pObj) )
        return Gia_ObjTimeArrival(p, Gia_ObjFaninId0p(p, pObj) );
    assert( Gia_ObjIsLut(p, iObj) );
    tArrival = -TIM_ETERNITY;
    if ( pLutLib == NULL )
    {
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( tArrival < Gia_ObjTimeArrival(p, iFanin) + 1.0 )
                tArrival = Gia_ObjTimeArrival(p, iFanin) + 1.0;
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( tArrival < Gia_ObjTimeArrival(p, iFanin) + pDelays[0] )
                tArrival = Gia_ObjTimeArrival(p, iFanin) + pDelays[0];
    }
    else
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        if ( fUseSorting )
        {
            Gia_LutDelayTraceSortPins( p, iObj, pPinPerm, pPinDelays );
            Gia_LutForEachFanin( p, iObj, iFanin, k ) 
                if ( tArrival < Gia_ObjTimeArrival( p, Gia_ObjLutFanin(p,iObj,pPinPerm[k])) + pDelays[k] )
                    tArrival = Gia_ObjTimeArrival( p, Gia_ObjLutFanin(p,iObj,pPinPerm[k])) + pDelays[k];
        }
        else
        {
            Gia_LutForEachFanin( p, iObj, iFanin, k )
                if ( tArrival < Gia_ObjTimeArrival(p, iFanin) + pDelays[k] )
                    tArrival = Gia_ObjTimeArrival(p, iFanin) + pDelays[k];
        }
    }
    if ( Gia_ObjLutSize(p, iObj) == 0 )
        tArrival = 0.0;
    return tArrival;
}